

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O2

uint32 trans_scanner_block_hash_fn(ScannerBlock *b,hash_fns_t *fns)

{
  uint32 uVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  
  pvVar3 = (void *)0x0;
  pvVar2 = fns->data[0];
  if ((long)fns->data[0] < 1) {
    pvVar2 = pvVar3;
  }
  uVar1 = 0;
  for (; pvVar2 != pvVar3; pvVar3 = (void *)((long)pvVar3 + 1)) {
    if (b->transitions[(long)pvVar3] == (ScanStateTransition *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = b->transitions[(long)pvVar3]->index + 1;
    }
    uVar1 = uVar1 * 3 + iVar4;
  }
  return uVar1;
}

Assistant:

static uint32 trans_scanner_block_hash_fn(ScannerBlock *b, hash_fns_t *fns) {
  uint32 hash = 0;
  intptr_t i, block_size = (intptr_t)fns->data[0];
  ScanStateTransition **sb = b->transitions;

  for (i = 0; i < block_size; i++) {
    hash *= 3;
    hash += sb[i] ? sb[i]->index + 1 : 0;
  }
  return hash;
}